

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cxx
# Opt level: O1

int read_file(char *filename,int merge)

{
  int iVar1;
  uint uVar2;
  Fl_Type *pFVar3;
  Fl_Type *pFVar4;
  
  read_version = 0.0;
  iVar1 = open_read(filename);
  if (iVar1 == 0) {
    uVar2 = 0;
  }
  else {
    if (merge == 0) {
      delete_all(0);
    }
    else {
      deselect();
    }
    read_children(Fl_Type::current,merge);
    Fl_Type::current = (Fl_Type *)0x0;
    for (pFVar4 = Fl_Type::first; pFVar3 = Fl_Type::first, pFVar4 != (Fl_Type *)0x0;
        pFVar4 = pFVar4->next) {
      iVar1 = (*pFVar4->_vptr_Fl_Type[0x1f])(pFVar4);
      if (iVar1 != 0) {
        (*pFVar4->_vptr_Fl_Type[8])(pFVar4,0,0);
      }
    }
    for (; (pFVar4 = Fl_Type::current, pFVar3 != (Fl_Type *)0x0 &&
           (pFVar4 = pFVar3, pFVar3->selected == '\0')); pFVar3 = pFVar3->next) {
    }
    Fl_Type::current = pFVar4;
    selection_changed(Fl_Type::current);
    if (fin == _stdin) {
      uVar2 = 1;
    }
    else {
      uVar2 = fclose((FILE *)fin);
      fin = (FILE *)0x0;
      uVar2 = ~uVar2 >> 0x1f;
    }
  }
  return uVar2;
}

Assistant:

int read_file(const char *filename, int merge) {
  Fl_Type *o;
  read_version = 0.0;
  if (!open_read(filename)) return 0;
  if (merge) deselect(); else    delete_all();
  read_children(Fl_Type::current, merge);
  Fl_Type::current = 0;
  // Force menu items to be rebuilt...
  for (o = Fl_Type::first; o; o = o->next)
    if (o->is_menu_button()) o->add_child(0,0);
  for (o = Fl_Type::first; o; o = o->next)
    if (o->selected) {Fl_Type::current = o; break;}
  selection_changed(Fl_Type::current);
  return close_read();
}